

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::OP_InitPropertyScoped
               (FrameDisplay *pScope,PropertyId propertyId,Var newValue,Var defaultInstance,
               ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  uint16 uVar3;
  int iVar4;
  long *plVar5;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  DynamicObject *obj;
  int length;
  int i;
  ScriptContext *scriptContext_local;
  Var defaultInstance_local;
  Var newValue_local;
  PropertyId propertyId_local;
  FrameDisplay *pScope_local;
  
  uVar3 = FrameDisplay::GetLength(pScope);
  obj._4_4_ = 0;
  while( true ) {
    if ((int)(uint)uVar3 <= (int)obj._4_4_) {
      bVar2 = TaggedNumber::Is(defaultInstance);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0xd0d,"(!TaggedNumber::Is(defaultInstance))",
                                    "Root object is an int or tagged float?");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      pRVar7 = VarTo<Js::RecyclableObject>(defaultInstance);
      iVar4 = (*(pRVar7->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x1f])(pRVar7,(ulong)(uint)propertyId,newValue);
      return iVar4;
    }
    plVar5 = (long *)FrameDisplay::GetItem(pScope,obj._4_4_);
    iVar4 = (**(code **)(*plVar5 + 0xf8))(plVar5,propertyId,newValue);
    if (iVar4 != 0) break;
    obj._4_4_ = obj._4_4_ + 1;
  }
  return 1;
}

Assistant:

BOOL JavascriptOperators::OP_InitPropertyScoped(FrameDisplay *pScope, PropertyId propertyId, Var newValue, Var defaultInstance, ScriptContext* scriptContext)
    {
        int i;
        int length = pScope->GetLength();
        DynamicObject *obj;

        for (i = 0; i < length; i++)
        {
            obj = (DynamicObject*)pScope->GetItem(i);
            if (obj->InitPropertyScoped(propertyId, newValue))
            {
                return TRUE;
            }
        }

        AssertMsg(!TaggedNumber::Is(defaultInstance), "Root object is an int or tagged float?");
        return VarTo<RecyclableObject>(defaultInstance)->InitPropertyScoped(propertyId, newValue);
    }